

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

Symbol __thiscall
google::protobuf::DescriptorPool::Tables::FindByNameHelper
          (Tables *this,DescriptorPool *pool,StringPiece name)

{
  pthread_mutex_t *__mutex;
  DescriptorPool *pool_00;
  int iVar1;
  char *str;
  char *pcVar2;
  __node_base_ptr p_Var3;
  _Hash_node_base *p_Var4;
  Symbol SVar5;
  __hash_code _Var6;
  _Hash_node_base *p_Var7;
  char *pcVar8;
  _Hash_node_base *unaff_RBP;
  _Hashtable<google::protobuf::Symbol,_google::protobuf::Symbol,_std::allocator<google::protobuf::Symbol>,_std::__detail::_Identity,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *p_Var9;
  bool bVar10;
  StringPiece SVar11;
  StringPiece SVar12;
  MutexLockMaybe lock;
  key_type local_78;
  _Hashtable<google::protobuf::Symbol,_google::protobuf::Symbol,_std::allocator<google::protobuf::Symbol>,_std::__detail::_Identity,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *local_70;
  MutexLockMaybe local_68;
  Symbol local_60;
  SymbolBase local_58 [8];
  char *local_50;
  size_type sStack_48;
  
  SVar12.length_ = name.length_;
  __mutex = (pthread_mutex_t *)pool->mutex_;
  p_Var9 = (_Hashtable<google::protobuf::Symbol,_google::protobuf::Symbol,_std::allocator<google::protobuf::Symbol>,_std::__detail::_Identity,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            *)name.ptr_;
  if (__mutex != (pthread_mutex_t *)0x0) {
    local_70 = (_Hashtable<google::protobuf::Symbol,_google::protobuf::Symbol,_std::allocator<google::protobuf::Symbol>,_std::__detail::_Identity,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                *)name.ptr_;
    iVar1 = pthread_mutex_lock(__mutex);
    if (iVar1 != 0) {
      std::__throw_system_error(iVar1);
    }
    bVar10 = true;
    if ((this->known_bad_files_)._M_h._M_element_count == 0 &&
        (this->known_bad_symbols_)._M_h._M_element_count == 0) {
      local_78.ptr_ = local_58;
      local_50 = (char *)local_70;
      local_58[0].symbol_type_ = '\n';
      local_60.ptr_ = local_78.ptr_;
      sStack_48 = SVar12.length_;
      SVar11 = Symbol::full_name(&local_60);
      pcVar2 = SVar11.ptr_;
      if ((long)SVar11.length_ < 1) {
        _Var6 = 0;
      }
      else {
        pcVar8 = pcVar2 + SVar11.length_;
        _Var6 = 0;
        do {
          _Var6 = (long)*pcVar2 + _Var6 * 5;
          pcVar2 = pcVar2 + 1;
        } while (pcVar2 < pcVar8);
      }
      p_Var3 = std::
               _Hashtable<google::protobuf::Symbol,_google::protobuf::Symbol,_std::allocator<google::protobuf::Symbol>,_std::__detail::_Identity,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
               ::_M_find_before_node
                         (&(this->symbols_by_name_)._M_h,
                          _Var6 % (this->symbols_by_name_)._M_h._M_bucket_count,&local_78,_Var6);
      if (p_Var3 == (__node_base_ptr)0x0) {
        p_Var4 = (_Hash_node_base *)0x0;
      }
      else {
        p_Var4 = p_Var3->_M_nxt;
      }
      p_Var7 = (_Hash_node_base *)&(anonymous_namespace)::kNullSymbol;
      if (p_Var4 != (_Hash_node_base *)0x0) {
        p_Var7 = p_Var4 + 1;
      }
      unaff_RBP = p_Var7->_M_nxt;
      if (unaff_RBP != (_Hash_node_base *)0x0) {
        bVar10 = *(char *)&unaff_RBP->_M_nxt == '\0';
      }
    }
    pthread_mutex_unlock(__mutex);
    p_Var9 = local_70;
    if (!bVar10) {
      return (Symbol)unaff_RBP;
    }
  }
  internal::MutexLockMaybe::MutexLockMaybe(&local_68,pool->mutex_);
  if (pool->fallback_database_ != (DescriptorDatabase *)0x0) {
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::clear(&(this->known_bad_symbols_)._M_h);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::clear(&(this->known_bad_files_)._M_h);
  }
  local_58[0].symbol_type_ = '\n';
  local_78.ptr_ = local_58;
  local_60.ptr_ = local_58;
  local_50 = (char *)p_Var9;
  sStack_48 = SVar12.length_;
  SVar11 = Symbol::full_name(&local_60);
  pcVar2 = SVar11.ptr_;
  local_70 = &(this->symbols_by_name_)._M_h;
  if ((long)SVar11.length_ < 1) {
    _Var6 = 0;
  }
  else {
    pcVar8 = pcVar2 + SVar11.length_;
    _Var6 = 0;
    do {
      _Var6 = (long)*pcVar2 + _Var6 * 5;
      pcVar2 = pcVar2 + 1;
    } while (pcVar2 < pcVar8);
  }
  p_Var3 = std::
           _Hashtable<google::protobuf::Symbol,_google::protobuf::Symbol,_std::allocator<google::protobuf::Symbol>,_std::__detail::_Identity,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
           ::_M_find_before_node
                     (local_70,_Var6 % (this->symbols_by_name_)._M_h._M_bucket_count,&local_78,_Var6
                     );
  if (p_Var3 == (__node_base_ptr)0x0) {
    p_Var4 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var4 = p_Var3->_M_nxt;
  }
  p_Var7 = p_Var4 + 1;
  if (p_Var4 == (_Hash_node_base *)0x0) {
    p_Var7 = (_Hash_node_base *)&(anonymous_namespace)::kNullSymbol;
  }
  SVar5.ptr_ = (SymbolBase *)p_Var7->_M_nxt;
  if ((((_Hash_node_base *)SVar5.ptr_ == (_Hash_node_base *)0x0) ||
      (*(char *)&((_Hash_node_base *)SVar5.ptr_)->_M_nxt == '\0')) &&
     (pool_00 = pool->underlay_, pool_00 != (DescriptorPool *)0x0)) {
    SVar12.ptr_ = (char *)p_Var9;
    SVar5 = FindByNameHelper((pool_00->tables_)._M_t.
                             super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                             .
                             super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>
                             ._M_head_impl,pool_00,SVar12);
  }
  if ((((_Hash_node_base *)SVar5.ptr_ == (_Hash_node_base *)0x0) ||
      (*(char *)&((_Hash_node_base *)SVar5.ptr_)->_M_nxt == '\0')) &&
     (SVar11.length_ = SVar12.length_, SVar11.ptr_ = (char *)p_Var9,
     bVar10 = TryFindSymbolInFallbackDatabase(pool,SVar11), bVar10)) {
    local_58[0].symbol_type_ = '\n';
    local_78.ptr_ = local_58;
    local_60.ptr_ = local_58;
    local_50 = (char *)p_Var9;
    sStack_48 = SVar12.length_;
    SVar12 = Symbol::full_name(&local_60);
    pcVar2 = SVar12.ptr_;
    if ((long)SVar12.length_ < 1) {
      _Var6 = 0;
    }
    else {
      pcVar8 = pcVar2 + SVar12.length_;
      _Var6 = 0;
      do {
        _Var6 = (long)*pcVar2 + _Var6 * 5;
        pcVar2 = pcVar2 + 1;
      } while (pcVar2 < pcVar8);
    }
    p_Var3 = std::
             _Hashtable<google::protobuf::Symbol,_google::protobuf::Symbol,_std::allocator<google::protobuf::Symbol>,_std::__detail::_Identity,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
             ::_M_find_before_node
                       (local_70,_Var6 % (this->symbols_by_name_)._M_h._M_bucket_count,&local_78,
                        _Var6);
    if (p_Var3 == (__node_base_ptr)0x0) {
      p_Var4 = (_Hash_node_base *)0x0;
    }
    else {
      p_Var4 = p_Var3->_M_nxt;
    }
    p_Var7 = p_Var4 + 1;
    if (p_Var4 == (_Hash_node_base *)0x0) {
      p_Var7 = (_Hash_node_base *)&(anonymous_namespace)::kNullSymbol;
    }
    SVar5.ptr_ = (SymbolBase *)p_Var7->_M_nxt;
  }
  if ((pthread_mutex_t *)local_68.mu_ != (pthread_mutex_t *)0x0) {
    pthread_mutex_unlock((pthread_mutex_t *)local_68.mu_);
  }
  return (Symbol)SVar5.ptr_;
}

Assistant:

Symbol DescriptorPool::Tables::FindByNameHelper(const DescriptorPool* pool,
                                                StringPiece name) {
  if (pool->mutex_ != nullptr) {
    // Fast path: the Symbol is already cached.  This is just a hash lookup.
    ReaderMutexLock lock(pool->mutex_);
    if (known_bad_symbols_.empty() && known_bad_files_.empty()) {
      Symbol result = FindSymbol(name);
      if (!result.IsNull()) return result;
    }
  }
  MutexLockMaybe lock(pool->mutex_);
  if (pool->fallback_database_ != nullptr) {
    known_bad_symbols_.clear();
    known_bad_files_.clear();
  }
  Symbol result = FindSymbol(name);

  if (result.IsNull() && pool->underlay_ != nullptr) {
    // Symbol not found; check the underlay.
    result = pool->underlay_->tables_->FindByNameHelper(pool->underlay_, name);
  }

  if (result.IsNull()) {
    // Symbol still not found, so check fallback database.
    if (pool->TryFindSymbolInFallbackDatabase(name)) {
      result = FindSymbol(name);
    }
  }

  return result;
}